

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util-test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_354d::UtilTest_Split_Test::~UtilTest_Split_Test(UtilTest_Split_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UtilTest, Split) {
  std::vector<std::string> result = Split("abc", ' ');
  EXPECT_EQ(1u, result.size());
  EXPECT_EQ("abc", result[0]);
  result = Split("a b c", ' ');
  EXPECT_EQ(3u, result.size());
  EXPECT_EQ("a", result[0]);
  EXPECT_EQ("b", result[1]);
  EXPECT_EQ("c", result[2]);
  result = Split("abc ", ' ');
  EXPECT_EQ(2u, result.size());
  EXPECT_EQ("abc", result[0]);
  EXPECT_EQ("", result[1]);
}